

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EmptyPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1)

{
  Info *pIVar1;
  size_t sVar2;
  pointer ppAVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  EmptyPortConnectionSyntax *pEVar10;
  long lVar11;
  
  pEVar10 = (EmptyPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyPortConnectionSyntax *)this->endPtr < pEVar10 + 1) {
    pEVar10 = (EmptyPortConnectionSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pEVar10 + 1);
  }
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pEVar10->super_PortConnectionSyntax).super_SyntaxNode.kind = EmptyPortConnection;
  (pEVar10->super_PortConnectionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar10->super_PortConnectionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
       = uVar5;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar4;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
       = (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pEVar10->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pEVar10->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cb67f8;
  (pEVar10->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pEVar10;
  sVar2 = (pEVar10->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppAVar3 = (pEVar10->super_PortConnectionSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar11 = 0;
    do {
      *(EmptyPortConnectionSyntax **)(*(long *)((long)ppAVar3 + lVar11) + 8) = pEVar10;
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
  }
  (pEVar10->placeholder).kind = TVar6;
  (pEVar10->placeholder).field_0x2 = uVar7;
  (pEVar10->placeholder).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar10->placeholder).rawLen = uVar9;
  (pEVar10->placeholder).info = pIVar1;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }